

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverAnyLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  bool bVar1;
  uint uVar2;
  Mvc_Cube_t *pMVar3;
  bool bVar4;
  
  uVar2 = pCover->nBits;
  do {
    do {
      if ((int)uVar2 < 1) {
        return -1;
      }
      uVar2 = uVar2 - 1;
    } while ((pMask != (Mvc_Cube_t *)0x0) && ((pMask->pData[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0)
            );
    pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
    bVar4 = true;
    while (pMVar3 = pMVar3->pNext, pMVar3 != (Mvc_Cube_t *)0x0) {
      if (((pMVar3->pData[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) != 0) &&
         (bVar1 = !bVar4, bVar4 = false, bVar1)) {
        return uVar2;
      }
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the any literal that occurs more than once.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Mvc_CoverAnyLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit, i;
    int nLitsCur;
    int fUseFirst = 0;

    // go through each literal
    if ( fUseFirst )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    else
    {
        for ( i = pCover->nBits - 1; i >=0; i-- )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    return -1;
}